

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Performance::LoopCase::~LoopCase(LoopCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  Functions *gl;
  LoopCase *this_local;
  
  (this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__LoopCase_032a3e70;
  iVar1 = (*((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_renderCtx)->
            _vptr_RenderContext[3])();
  if (this->m_arrayBuffer != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_arrayBuffer);
    this->m_arrayBuffer = 0;
  }
  std::vector<float,_std::allocator<float>_>::~vector(&this->m_boundArray);
  ControlStatementCase::~ControlStatementCase(&this->super_ControlStatementCase);
  return;
}

Assistant:

LoopCase::~LoopCase (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_arrayBuffer)
	{
		gl.deleteBuffers(1, &m_arrayBuffer);
		m_arrayBuffer = 0;
	}
}